

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conversion_exception.cpp
# Opt level: O0

void __thiscall
duckdb::ConversionException::ConversionException
          (ConversionException *this,PhysicalType orig_type,PhysicalType new_type)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  PhysicalType in_stack_0000001f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_c0 [32];
  string *in_stack_ffffffffffffff60;
  undefined7 in_stack_ffffffffffffff68;
  ExceptionType in_stack_ffffffffffffff6f;
  Exception *in_stack_ffffffffffffff70;
  string local_70 [32];
  string local_50 [32];
  string local_30 [48];
  
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff70;
  TypeIdToString_abi_cxx11_(in_stack_0000001f);
  ::std::operator+((char *)__lhs,in_RDI);
  ::std::operator+(__lhs,(char *)in_RDI);
  TypeIdToString_abi_cxx11_(in_stack_0000001f);
  ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_ffffffffffffff6f,in_stack_ffffffffffffff68),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_ffffffffffffff60);
  Exception::Exception
            (in_stack_ffffffffffffff70,in_stack_ffffffffffffff6f,in_stack_ffffffffffffff60);
  ::std::__cxx11::string::~string(local_30);
  ::std::__cxx11::string::~string(local_c0);
  ::std::__cxx11::string::~string(local_50);
  ::std::__cxx11::string::~string(local_70);
  ::std::__cxx11::string::~string((string *)&stack0xffffffffffffff70);
  *(undefined ***)in_RDI = &PTR__ConversionException_03500960;
  return;
}

Assistant:

ConversionException::ConversionException(const PhysicalType orig_type, const PhysicalType new_type)
    : Exception(ExceptionType::CONVERSION,
                "Type " + TypeIdToString(orig_type) + " can't be cast as " + TypeIdToString(new_type)) {
}